

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
cmELFInternalImpl<cmELFTypes64>::EncodeDynamicEntries
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,
          cmELFInternalImpl<cmELFTypes64> *this,DynamicEntryList *entries)

{
  bool bVar1;
  size_type sVar2;
  char *pdyn;
  ELF_Dyn dyn;
  pair<long,_unsigned_long> *entry;
  const_iterator __end1;
  const_iterator __begin1;
  DynamicEntryList *__range1;
  DynamicEntryList *entries_local;
  cmELFInternalImpl<cmELFTypes64> *this_local;
  vector<char,_std::allocator<char>_> *result;
  
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__);
  sVar2 = std::
          vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
          size(entries);
  std::vector<char,_std::allocator<char>_>::reserve(__return_storage_ptr__,sVar2 << 4);
  __end1 = std::
           vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           ::begin(entries);
  entry = (pair<long,_unsigned_long> *)
          std::
          vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
          end(entries);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
                                     *)&entry), bVar1) {
    dyn.d_un = (anon_union_8_2_f9000a74_for_d_un)
               __gnu_cxx::
               __normal_iterator<const_std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
               ::operator*(&__end1);
    pdyn = *(char **)dyn.d_un;
    dyn.d_tag = *(unsigned_long *)(dyn.d_un.d_val + 8);
    if (((this->super_cmELFInternal).NeedSwap & 1U) != 0) {
      ByteSwap(this,(ELF_Dyn *)&pdyn);
    }
    cmAppend<char,char*>(__return_storage_ptr__,(char *)&pdyn,(char *)&dyn.d_un.d_val);
    __gnu_cxx::
    __normal_iterator<const_std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> cmELFInternalImpl<Types>::EncodeDynamicEntries(
  const cmELF::DynamicEntryList& entries)
{
  std::vector<char> result;
  result.reserve(sizeof(ELF_Dyn) * entries.size());

  for (auto const& entry : entries) {
    // Store the entry in an ELF_Dyn, byteswap it, then serialize to chars
    ELF_Dyn dyn;
    dyn.d_tag = static_cast<tagtype>(entry.first);
    dyn.d_un.d_val = static_cast<tagtype>(entry.second);

    if (this->NeedSwap) {
      ByteSwap(dyn);
    }

    char* pdyn = reinterpret_cast<char*>(&dyn);
    cmAppend(result, pdyn, pdyn + sizeof(ELF_Dyn));
  }

  return result;
}